

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_permute_rows(m256v *M,int *rowperm)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  undefined1 *__dest;
  size_t __n;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined1 *__s;
  int *piVar8;
  undefined1 *puVar9;
  int i;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  int *local_48;
  undefined1 *local_40;
  size_t local_38;
  
  uVar11 = M->n_row;
  lVar5 = -((ulong)uVar11 + 0xf & 0xfffffffffffffff0);
  __s = auStack_58 + lVar5;
  if (0 < (int)uVar11) {
    uVar10 = 0;
    local_48 = rowperm;
    local_40 = __s;
    *(undefined8 *)((long)&uStack_60 + lVar5) = 0x102a58;
    memset(__s,0,(ulong)uVar11);
    uVar11 = M->n_col;
    uVar6 = (ulong)uVar11;
    uVar1 = uVar6 + 0xf;
    uVar12 = (ulong)uVar11;
    piVar8 = local_48;
    puVar9 = local_40;
    local_50 = __s + -(uVar1 & 0xfffffffffffffff0);
    local_38 = uVar6;
    do {
      __n = local_38;
      __dest = local_50;
      if (puVar9[uVar10] == '\0') {
        uVar2 = piVar8[uVar10];
        if (uVar10 == uVar2) {
          puVar9[uVar10] = 1;
        }
        else {
          if (0 < (int)uVar6) {
            sVar3 = M->rstride;
            puVar4 = M->e;
            *(undefined8 *)(__s + -(uVar1 & 0xfffffffffffffff0) + -8) = 0x102abd;
            memcpy(__dest,puVar4 + sVar3 * uVar10,__n);
            piVar8 = local_48;
            puVar9 = local_40;
          }
          uVar6 = uVar10 & 0xffffffff;
          uVar13 = (ulong)uVar2;
          do {
            lVar5 = (long)(int)uVar13;
            puVar9[lVar5] = 1;
            if (0 < (int)uVar11) {
              lVar7 = 0;
              do {
                M->e[lVar7 + M->rstride * (long)(int)uVar6] = M->e[lVar7 + M->rstride * lVar5];
                lVar7 = lVar7 + 1;
                uVar11 = M->n_col;
                uVar12 = (ulong)(int)uVar11;
              } while (lVar7 < (long)uVar12);
            }
            uVar6 = uVar13;
            uVar13 = (ulong)(uint)piVar8[lVar5];
          } while (uVar10 != (uint)piVar8[lVar5]);
          puVar9[uVar10] = 1;
          uVar11 = (uint)uVar12;
          uVar6 = local_38;
          if (0 < (int)uVar11) {
            lVar7 = 0;
            do {
              M->e[lVar7 + M->rstride * lVar5] = local_50[lVar7];
              lVar7 = lVar7 + 1;
              uVar11 = M->n_col;
              uVar12 = (ulong)(int)uVar11;
            } while (lVar7 < (long)uVar12);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)M->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}